

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::Bitstream::evaluateCast
          (ConstantValue *__return_storage_ptr__,Bitstream *this,Type *type,ConstantValue *value,
          SourceRange sourceRange,EvalContext *context,bool isImplicit)

{
  SourceRange range;
  SourceRange range_00;
  bool bVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  Diagnostic *pDVar4;
  pointer ppCVar5;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  uint64_t bitOffset;
  const_iterator iter;
  pointer local_b0;
  SourceLocation local_a8;
  SourceLocation local_a0;
  SourceLocation local_98;
  undefined1 local_90 [16];
  size_type local_80;
  ConstantValue *local_78 [5];
  DynamicSize local_50;
  ConstantValue **local_38;
  
  local_a8 = sourceRange.endLoc;
  local_98 = sourceRange.startLoc;
  local_a0 = (SourceLocation)value;
  ppCVar2 = (pointer)ConstantValue::getBitstreamWidth((ConstantValue *)type);
  local_b0 = (pointer)0x0;
  if ((char)context == '\0') {
    bVar1 = Type::isFixedSize((Type *)this);
    if (bVar1) {
      ppCVar5 = (pointer)Type::getBitstreamWidth((Type *)this);
      ppCVar5 = (pointer)-(ulong)(ppCVar5 != ppCVar2);
    }
    else {
      dynamicBitstreamSize((DynamicSize *)local_90,(Type *)this,DestEmpty);
      ppCVar5 = (pointer)0xffffffffffffffff;
      if ((local_80._0_1_ == true) && ((ulong)local_90._8_8_ <= ppCVar2)) {
        if ((long)ppCVar2 - local_90._8_8_ == 0) {
          ppCVar5 = (pointer)0x0;
        }
        else {
          dynamicBitstreamSize(&local_50,(Type *)this,DestFill);
          ppCVar5 = (pointer)0xffffffffffffffff;
          if (((local_50.isValid == true) &&
              ((ppCVar5 = (pointer)((long)ppCVar2 - local_50.fixed), ppCVar2 < local_50.fixed ||
               ((local_50.multiplier != 0 && ((ulong)ppCVar5 % local_50.multiplier != 0)))))) &&
             (((pointer)local_90._0_8_ == (pointer)0x0 ||
              (ppCVar5 = (pointer)0x0,
              (ulong)((long)ppCVar2 - local_90._8_8_) % (ulong)local_90._0_8_ != 0)))) {
            ppCVar5 = (pointer)0xffffffffffffffff;
          }
        }
      }
    }
    if (ppCVar2 < ppCVar5) {
      range_00.endLoc = local_98;
      range_00.startLoc = local_a0;
      local_b0 = ppCVar5;
      pDVar4 = EvalContext::addDiag((EvalContext *)local_a8,(DiagCode)0x2000c,range_00);
      local_90._0_8_ = ConstantValue::getBitstreamWidth((ConstantValue *)type);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar4->args,(unsigned_long *)local_90);
      ast::operator<<(pDVar4,(Type *)this);
      goto LAB_00287f16;
    }
  }
  else {
    ppCVar3 = (pointer)Type::getBitstreamWidth((Type *)this);
    ppCVar5 = local_b0;
    if ((ppCVar3 <= ppCVar2 && (pointer)((long)ppCVar2 - (long)ppCVar3) != (pointer)0x0) &&
       (bVar1 = Type::isFixedSize((Type *)this), ppCVar5 = (pointer)((long)ppCVar2 - (long)ppCVar3),
       bVar1)) {
      range.endLoc = local_98;
      range.startLoc = local_a0;
      pDVar4 = EvalContext::addDiag((EvalContext *)local_a8,(DiagCode)0x2c0007,range);
      local_90._0_8_ = ppCVar3;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar4->args,(unsigned_long *)local_90);
      local_90._0_8_ = ppCVar2;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar4->args,(unsigned_long *)local_90);
LAB_00287f16:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\0';
      return __return_storage_ptr__;
    }
  }
  local_b0 = ppCVar5;
  local_90._8_8_ = 0;
  local_80 = 5;
  local_90._0_8_ = local_78;
  packBitstream((ConstantValue *)type,(SmallVectorBase<slang::ConstantValue_*> *)local_90);
  local_50.multiplier = 0;
  local_38 = (ConstantValue **)local_90._0_8_;
  unpackBitstream(__return_storage_ptr__,(Type *)this,&local_38,
                  (PackIterator)(local_90._0_8_ + local_90._8_8_ * 8),&local_50.multiplier,
                  (uint64_t *)&local_b0);
  if ((ConstantValue **)local_90._0_8_ != local_78) {
    operator_delete((void *)local_90._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue Bitstream::evaluateCast(const Type& type, ConstantValue&& value,
                                      SourceRange sourceRange, EvalContext& context,
                                      bool isImplicit) {
    auto srcSize = value.getBitstreamWidth();
    uint64_t dynamicSize = 0;
    if (!isImplicit) { // Explicit bit-stream casting
        dynamicSize = bitstreamCastRemainingSize(type, srcSize);
        if (dynamicSize > srcSize) {
            context.addDiag(diag::ConstEvalBitstreamCastSize, sourceRange)
                << value.getBitstreamWidth() << type;
            return nullptr;
        }
    }
    else { // implicit streaming concatenation conversion
        auto targetWidth = type.getBitstreamWidth();
        if (targetWidth < srcSize) {
            if (type.isFixedSize()) {
                context.addDiag(diag::BadStreamSize, sourceRange) << targetWidth << srcSize;
                return nullptr;
            }
            dynamicSize = srcSize - targetWidth;
        }
    }

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);

    uint64_t bitOffset = 0;
    auto iter = std::cbegin(packed);
    auto cv = unpackBitstream(type, iter, std::cend(packed), bitOffset, dynamicSize);
    SLANG_ASSERT(!dynamicSize);
    SLANG_ASSERT(isImplicit || (iter == std::cend(packed) && !bitOffset));
    return cv;
}